

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.h
# Opt level: O0

void __thiscall sc_core::sc_signal_channel::notify_next_delta(sc_signal_channel *this,sc_event *ev)

{
  sc_event *in_RSI;
  
  if (in_RSI != (sc_event *)0x0) {
    sc_event::notify_next_delta(in_RSI);
  }
  return;
}

Assistant:

void notify_next_delta( sc_event* ev ) const
        { if( ev ) ev->notify_next_delta(); }